

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

Cnf_Dat_t * Jf_ManCreateCnfRemap(Gia_Man_t *p,Vec_Int_t *vLits,Vec_Int_t *vClas,int fAddOrCla)

{
  int Var;
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  int *__s;
  Cnf_Dat_t *pCVar6;
  int **ppiVar7;
  int iVar8;
  long lVar9;
  
  if (fAddOrCla != 0) {
    Vec_IntPush(vClas,vLits->nSize);
    for (iVar8 = 0; iVar8 < p->vCos->nSize - p->nRegs; iVar8 = iVar8 + 1) {
      pGVar5 = Gia_ManCo(p,iVar8);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ObjId(p,pGVar5);
      iVar2 = Abc_Var2Lit(iVar2,0);
      Vec_IntPush(vLits,iVar2);
    }
  }
  for (iVar8 = 0; iVar8 < vLits->nSize; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(vLits,iVar8);
    iVar2 = Abc_Lit2Var(iVar2);
    pGVar5 = Gia_ManObj(p,iVar2);
    pGVar5->field_0x3 = pGVar5->field_0x3 | 0x40;
  }
  uVar4 = p->nObjs;
  __s = (int *)malloc((long)(int)uVar4 << 2);
  memset(__s,0xff,(long)(int)uVar4 << 2);
  iVar8 = 0;
  while (0 < (int)uVar4) {
    pGVar5 = Gia_ManObj(p,uVar4 - 1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar4 = uVar4 - 1;
    if (((uint)*(ulong *)pGVar5 >> 0x1e & 1) != 0) {
      *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffbfffffff;
      __s[uVar4] = iVar8;
      iVar8 = iVar8 + 1;
    }
  }
  iVar2 = 0;
  while( true ) {
    iVar3 = vLits->nSize;
    if (iVar3 <= iVar2) {
      pCVar6 = (Cnf_Dat_t *)calloc(1,0x48);
      pCVar6->pMan = (Aig_Man_t *)p;
      pCVar6->nVars = iVar8;
      pCVar6->nLiterals = iVar3;
      iVar8 = vClas->nSize;
      pCVar6->nClauses = iVar8;
      ppiVar7 = (int **)malloc((long)iVar8 * 8 + 8);
      pCVar6->pClauses = ppiVar7;
      piVar1 = vLits->pArray;
      vLits->nCap = 0;
      vLits->nSize = 0;
      vLits->pArray = (int *)0x0;
      *ppiVar7 = piVar1;
      for (lVar9 = 0; lVar9 < vClas->nSize; lVar9 = lVar9 + 1) {
        iVar8 = Vec_IntEntry(vClas,(int)lVar9);
        ppiVar7[lVar9] = *ppiVar7 + iVar8;
      }
      ppiVar7[lVar9] = *ppiVar7 + iVar3;
      pCVar6->pVarNums = __s;
      return pCVar6;
    }
    iVar3 = Vec_IntEntry(vLits,iVar2);
    if (iVar3 < 0) break;
    uVar4 = Abc_Lit2Var(iVar3);
    Var = __s[uVar4];
    iVar3 = Abc_LitIsCompl(iVar3);
    iVar3 = Abc_Var2Lit(Var,iVar3);
    Vec_IntWriteEntry(vLits,iVar2,iVar3);
    iVar2 = iVar2 + 1;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf7,"int Abc_Lit2LitV(int *, int)");
}

Assistant:

Cnf_Dat_t * Jf_ManCreateCnfRemap( Gia_Man_t * p, Vec_Int_t * vLits, Vec_Int_t * vClas, int fAddOrCla )
{
    Cnf_Dat_t * pCnf; 
    Gia_Obj_t * pObj;
    int i, Entry, * pMap, nVars = 0;
    if ( fAddOrCla )
    {
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vLits, Abc_Var2Lit(Gia_ObjId(p, pObj), 0) );
    }
    // label nodes present in the mapping
    Vec_IntForEachEntry( vLits, Entry, i )
        Gia_ManObj(p, Abc_Lit2Var(Entry))->fMark0 = 1;
    // create variable map
    pMap = ABC_FALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObjReverse( p, pObj, i )
        if ( pObj->fMark0 )
            pObj->fMark0 = 0, pMap[i] = nVars++;
    // relabel literals
    Vec_IntForEachEntry( vLits, Entry, i )
        Vec_IntWriteEntry( vLits, i, Abc_Lit2LitV(pMap, Entry) );
    // generate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = (Aig_Man_t *)p;
    pCnf->nVars = nVars;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->nClauses = Vec_IntSize(vClas);
    pCnf->pClauses = ABC_ALLOC( int *, pCnf->nClauses+1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[i] = pCnf->pClauses[0] + pCnf->nLiterals;
    pCnf->pVarNums = pMap;
    return pCnf;
}